

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O3

uint8_t __thiscall
gui::ColorPicker::updateCurrentColor::anon_class_1_0_00000001::operator()
          (anon_class_1_0_00000001 *this,shared_ptr<gui::MultilineTextBox> *box)

{
  _Alloc_hider __nptr;
  uint8_t uVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  undefined8 uVar5;
  int iVar6;
  wstring local_70;
  wchar_t *local_50;
  String local_48;
  
  MultilineTextBox::getText(&local_48,(MultilineTextBox *)this);
  sf::String::toWideString_abi_cxx11_(&local_70,&local_48);
  __nptr._M_p = local_70._M_dataplus._M_p;
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  *piVar3 = 0;
  lVar4 = wcstol(__nptr._M_p,&local_50,10);
  if (local_50 == __nptr._M_p) {
    std::__throw_invalid_argument("stoi");
  }
  else {
    iVar6 = (int)lVar4;
    if ((iVar6 == lVar4) && (*piVar3 != 0x22)) {
      if (*piVar3 == 0) {
        *piVar3 = iVar2;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
           *)local_48.m_string._M_dataplus._M_p != &local_48.m_string.field_2) {
        operator_delete(local_48.m_string._M_dataplus._M_p);
      }
      iVar2 = 0;
      if (0 < iVar6) {
        iVar2 = iVar6;
      }
      uVar1 = (uint8_t)iVar2;
      if (0xfe < iVar2) {
        uVar1 = 0xff;
      }
      return uVar1;
    }
  }
  uVar5 = std::__throw_out_of_range("stoi");
  if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
       *)local_48.m_string._M_dataplus._M_p != &local_48.m_string.field_2) {
    operator_delete(local_48.m_string._M_dataplus._M_p);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

void ColorPicker::updateCurrentColor(ColorSource source, bool validateSource, const std::array<float, 4>& inputHsva) {
    auto getBoxValue = [](const std::shared_ptr<MultilineTextBox>& box) {
        int value = std::stoi(box->getText().toWideString());
        return static_cast<uint8_t>(std::min(std::max(value, 0), 255));
    };

    if (source != ColorSource::none) {
        // Set current color from source.
        if (source == ColorSource::rgba) {
            try {
                sf::Color rgba = {
                    getBoxValue(rgbaTextBoxes_[0]),
                    getBoxValue(rgbaTextBoxes_[1]),
                    getBoxValue(rgbaTextBoxes_[2]),
                    getBoxValue(rgbaTextBoxes_[3])
                };
                currentColorHsva_ = convertRgbToHsv(normalizeRgb(rgba));
            } catch (const std::invalid_argument& ex) {
                GUI_DEBUG << "ColorSource::rgba failed: " << ex.what() << "\n";
            }
        } else if (source == ColorSource::hsva) {
            try {
                HsvColor hsva = {
                    getBoxValue(hsvaTextBoxes_[0]),
                    getBoxValue(hsvaTextBoxes_[1]),
                    getBoxValue(hsvaTextBoxes_[2]),
                    getBoxValue(hsvaTextBoxes_[3])
                };
                currentColorHsva_ = normalizeHsv(hsva);
            } catch (const std::invalid_argument& ex) {
                GUI_DEBUG << "ColorSource::hsva failed: " << ex.what() << "\n";
            }
        } else if (source == ColorSource::rgbaHex) {
            try {
                sf::Color rgba(static_cast<uint32_t>(std::stoll(rgbaHexTextBox_->getText().toWideString(), nullptr, 16)));
                currentColorHsva_ = convertRgbToHsv(normalizeRgb(rgba));
            } catch (const std::invalid_argument& ex) {
                GUI_DEBUG << "ColorSource::rgbaHex failed: " << ex.what() << "\n";
            }
        } else if (source == ColorSource::inputHsva) {
            currentColorHsva_ = inputHsva;
            validateSource = true;
        }

        // Fill in text boxes from current color.
        const sf::Color roundedRgba = denormalizeRgb(convertHsvToRgb(currentColorHsva_));
        const HsvColor roundedHsva = denormalizeHsv(currentColorHsva_);
        if (source != ColorSource::rgba || validateSource) {
            for (auto& box : rgbaTextBoxes_) {
                box->onTextChange.setEnabled(false);
            }
            rgbaTextBoxes_[0]->setText(std::to_string(static_cast<int>(roundedRgba.r)));
            rgbaTextBoxes_[1]->setText(std::to_string(static_cast<int>(roundedRgba.g)));
            rgbaTextBoxes_[2]->setText(std::to_string(static_cast<int>(roundedRgba.b)));
            rgbaTextBoxes_[3]->setText(std::to_string(static_cast<int>(roundedRgba.a)));
            for (auto& box : rgbaTextBoxes_) {
                box->onTextChange.setEnabled(true);
            }
        }
        if (source != ColorSource::hsva || validateSource) {
            for (auto& box : hsvaTextBoxes_) {
                box->onTextChange.setEnabled(false);
            }
            hsvaTextBoxes_[0]->setText(std::to_string(static_cast<int>(roundedHsva.h)));
            hsvaTextBoxes_[1]->setText(std::to_string(static_cast<int>(roundedHsva.s)));
            hsvaTextBoxes_[2]->setText(std::to_string(static_cast<int>(roundedHsva.v)));
            hsvaTextBoxes_[3]->setText(std::to_string(static_cast<int>(roundedHsva.a)));
            for (auto& box : hsvaTextBoxes_) {
                box->onTextChange.setEnabled(true);
            }
        }
        if (source != ColorSource::rgbaHex || validateSource) {
            std::stringstream ss;
            ss << std::setfill('0') << std::setw(8) << std::hex << roundedRgba.toInteger();
            rgbaHexTextBox_->onTextChange.setEnabled(false);
            rgbaHexTextBox_->setText(ss.str());
            rgbaHexTextBox_->onTextChange.setEnabled(true);
        }

        hueSlider_->onValueChange.setEnabled(false);
        alphaSlider_->onValueChange.setEnabled(false);
        hueSlider_->setValue(currentColorHsva_[0]);
        alphaSlider_->setValue(1.0f - currentColorHsva_[3]);
        hueSlider_->onValueChange.setEnabled(true);
        alphaSlider_->onValueChange.setEnabled(true);

        if (roundedColorRgba_ != roundedRgba) {
            roundedColorRgba_ = roundedRgba;
            onColorChange.emit(this, roundedRgba);
        }
    }

    /**
     * To display the `shadingRectangle_`, we build a grid of triangles to
     * approximate a linearly interpolated color area. This does not work with
     * just two triangles as the interpolation of vertex coords in OpenGL uses
     * barycentric coordinates.
     * 
     * Example showing vertex indices forming the TriangleStrip, here the
     * `gridSideCount` is set to 3:
     * 
     *  0----2----4----6
     *  |  / |  / |  / |
     *  | /  | /  | /  |
     *  1----3----5----7
     * 14---12---10----8
     *  | \  | \  | \  |
     *  |  \ |  \ |  \ |
     * 15---13---11----9
     * 16---18---20---22
     *  |  / |  / |  / |
     *  | /  | /  | /  |
     * 17---19---21---23
     */

    constexpr int gridSideCount = 16;
    const sf::Vector2f shadingRectangleSize = getShadingRectangleSize();
    const sf::Vector2f gridSize = shadingRectangleSize / static_cast<float>(gridSideCount);

    const float hue = hueSlider_->getValue();
    shadingRectangle_.resize(2 * (gridSideCount + 1) * gridSideCount);

    int i = 0;
    for (int y = 0; y < gridSideCount; ++y) {
        int dx = 1 - (y % 2) * 2;
        int xStart = (y % 2 == 0 ? 0 : gridSideCount);
        int xStop = gridSideCount - xStart + dx;

        for (int x = xStart; x != xStop; x += dx) {
            sf::Color topColor, bottomColor;
            if (y == 0) {
                sf::Vector3f top = convertHsvToRgb(sf::Vector3f(hue, static_cast<float>(x) / gridSideCount, 1.0f - static_cast<float>(y) / gridSideCount));
                topColor = {
                    static_cast<uint8_t>(std::lround(top.x * 255.0f)),
                    static_cast<uint8_t>(std::lround(top.y * 255.0f)),
                    static_cast<uint8_t>(std::lround(top.z * 255.0f))
                };
            } else {
                topColor = shadingRectangle_[i - std::abs(x - xStart) * 4 - 1].color;
            }
            sf::Vector3f bottom = convertHsvToRgb(sf::Vector3f(hue, static_cast<float>(x) / gridSideCount, 1.0f - static_cast<float>(y + 1) / gridSideCount));
            bottomColor = {
                static_cast<uint8_t>(std::lround(bottom.x * 255.0f)),
                static_cast<uint8_t>(std::lround(bottom.y * 255.0f)),
                static_cast<uint8_t>(std::lround(bottom.z * 255.0f))
            };

            shadingRectangle_[i++] = {{x * gridSize.x, y * gridSize.y}, topColor};
            shadingRectangle_[i++] = {{x * gridSize.x, (y + 1) * gridSize.y}, bottomColor};
        }
    }
    assert(i == static_cast<int>(shadingRectangle_.getVertexCount()));

    requestRedraw();
}